

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen_casetab.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  byte bVar1;
  bool bVar2;
  _Setfill<char> _Var3;
  _Setw _Var4;
  ostream *poVar5;
  size_type sVar6;
  reference pvVar7;
  char *pcVar8;
  size_t sVar9;
  reference pvVar10;
  long lVar11;
  ulong local_980;
  size_t i_4;
  ulong local_970;
  size_t i_3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_960;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_940;
  undefined1 local_920 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  fields_1;
  undefined8 local_900;
  ulong local_8f0;
  size_t i_2;
  ulong local_8e0;
  size_t i_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_8d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_8b0;
  ostream local_890 [8];
  ofstream out;
  undefined1 local_688 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  fields;
  ifstream in;
  int local_468;
  int i;
  undefined1 local_458 [8];
  codept code;
  vector<codept,_std::allocator<codept>_> tab;
  char line [1024];
  char **argv_local;
  int argc_local;
  
  std::vector<codept,_std::allocator<codept>_>::vector
            ((vector<codept,_std::allocator<codept>_> *)((long)&code.descr.field_2 + 8));
  codept::codept((codept *)local_458);
  printf("gen_casetab running. Command line is:\n");
  for (local_468 = 0; local_468 < argc; local_468 = local_468 + 1) {
    printf("`%s` ",argv[local_468]);
  }
  printf("\n");
  if (argc < 2) {
    fprintf(_stderr,"Usage: gen_casetab <input table> <output folder>\n");
    exit(1);
  }
  std::ifstream::ifstream
            (&fields.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,argv[1],8);
  bVar1 = std::ifstream::is_open();
  if ((bVar1 & 1) == 0) {
    fprintf(_stderr,"gen_casetab: cannot open input table: %s\n",argv[1]);
    exit(1);
  }
  printf("Starting...\n");
  while (bVar2 = std::ios::operator_cast_to_bool
                           ((ios *)((long)&fields.
                                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_end_of_storage +
                                   fields.
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage[-1].
                                   _M_string_length)), bVar2) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_688);
    std::istream::getline
              ((char *)&fields.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage,
               (long)&tab.super__Vector_base<codept,_std::allocator<codept>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage);
    sVar9 = strlen((char *)&tab.super__Vector_base<codept,_std::allocator<codept>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage);
    if (((sVar9 != 0) &&
        ((char)tab.super__Vector_base<codept,_std::allocator<codept>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage != '#')) &&
       ((char)tab.super__Vector_base<codept,_std::allocator<codept>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage != '\r')) {
      bVar2 = parse((char *)&tab.super__Vector_base<codept,_std::allocator<codept>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage,
                    (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_688);
      if (bVar2) {
        pvVar10 = std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)local_688,0xd);
        bVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                empty(pvVar10);
        if (!bVar2) {
          pvVar10 = std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  *)local_688,0);
          pcVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                   c_str(pvVar10);
          lVar11 = strtol(pcVar8,(char **)0x0,0x10);
          local_458._0_4_ = (undefined4)lVar11;
          pvVar10 = std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  *)local_688,0xd);
          pcVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                   c_str(pvVar10);
          lVar11 = strtol(pcVar8,(char **)0x0,0x10);
          local_458._4_4_ = (undefined4)lVar11;
          pvVar10 = std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  *)local_688,1);
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&code,
                     pvVar10);
          std::vector<codept,_std::allocator<codept>_>::push_back
                    ((vector<codept,_std::allocator<codept>_> *)((long)&code.descr.field_2 + 8),
                     (value_type *)local_458);
        }
      }
      else {
        printf("Cannot parse line:\n%s\n",
               &tab.super__Vector_base<codept,_std::allocator<codept>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
      }
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_688);
  }
  pcVar8 = argv[2];
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_8d0,pcVar8,(allocator<char> *)((long)&i_1 + 7));
  std::operator+(&local_8b0,&local_8d0,"/uppertab.h");
  std::ofstream::ofstream(local_890,&local_8b0,0x10);
  std::__cxx11::string::~string((string *)&local_8b0);
  std::__cxx11::string::~string((string *)&local_8d0);
  std::allocator<char>::~allocator((allocator<char> *)((long)&i_1 + 7));
  poVar5 = std::operator<<(local_890,"//Upper case table");
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  poVar5 = std::operator<<(poVar5,"static const char32_t u2l [");
  sVar6 = std::vector<codept,_std::allocator<codept>_>::size
                    ((vector<codept,_std::allocator<codept>_> *)((long)&code.descr.field_2 + 8));
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,sVar6);
  poVar5 = std::operator<<(poVar5,"] = { ");
  std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  std::ostream::operator<<(local_890,std::hex);
  for (local_8e0 = 0;
      sVar6 = std::vector<codept,_std::allocator<codept>_>::size
                        ((vector<codept,_std::allocator<codept>_> *)((long)&code.descr.field_2 + 8))
      , local_8e0 < sVar6; local_8e0 = local_8e0 + 1) {
    poVar5 = std::operator<<(local_890,"  0x");
    _Var3 = std::setfill<char>('0');
    poVar5 = std::operator<<(poVar5,_Var3._M_c);
    _Var4 = std::setw(5);
    poVar5 = std::operator<<(poVar5,_Var4);
    pvVar7 = std::vector<codept,_std::allocator<codept>_>::operator[]
                       ((vector<codept,_std::allocator<codept>_> *)((long)&code.descr.field_2 + 8),
                        local_8e0);
    std::ostream::operator<<(poVar5,pvVar7->uc);
    sVar6 = std::vector<codept,_std::allocator<codept>_>::size
                      ((vector<codept,_std::allocator<codept>_> *)((long)&code.descr.field_2 + 8));
    if (local_8e0 == sVar6 - 1) {
      std::operator<<(local_890,"};");
    }
    else {
      std::operator<<(local_890,", ");
    }
    poVar5 = std::operator<<(local_890,"// ");
    pvVar7 = std::vector<codept,_std::allocator<codept>_>::operator[]
                       ((vector<codept,_std::allocator<codept>_> *)((long)&code.descr.field_2 + 8),
                        local_8e0);
    pcVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       (&pvVar7->descr);
    poVar5 = std::operator<<(poVar5,pcVar8);
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  }
  poVar5 = (ostream *)std::ostream::operator<<(local_890,std::dec);
  std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  poVar5 = std::operator<<(local_890,"//Lower case equivalents");
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  poVar5 = std::operator<<(poVar5,"static const char32_t lc [");
  sVar6 = std::vector<codept,_std::allocator<codept>_>::size
                    ((vector<codept,_std::allocator<codept>_> *)((long)&code.descr.field_2 + 8));
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,sVar6);
  std::operator<<(poVar5,"] = { ");
  std::ostream::operator<<(local_890,std::hex);
  for (local_8f0 = 0;
      sVar6 = std::vector<codept,_std::allocator<codept>_>::size
                        ((vector<codept,_std::allocator<codept>_> *)((long)&code.descr.field_2 + 8))
      , local_8f0 < sVar6; local_8f0 = local_8f0 + 1) {
    if ((local_8f0 & 7) == 0) {
      poVar5 = (ostream *)std::ostream::operator<<(local_890,std::endl<char,std::char_traits<char>>)
      ;
      std::operator<<(poVar5,"  ");
    }
    poVar5 = std::operator<<(local_890,"0x");
    _Var3 = std::setfill<char>('0');
    poVar5 = std::operator<<(poVar5,_Var3._M_c);
    _Var4 = std::setw(5);
    poVar5 = std::operator<<(poVar5,_Var4);
    pvVar7 = std::vector<codept,_std::allocator<codept>_>::operator[]
                       ((vector<codept,_std::allocator<codept>_> *)((long)&code.descr.field_2 + 8),
                        local_8f0);
    std::ostream::operator<<(poVar5,pvVar7->lc);
    sVar6 = std::vector<codept,_std::allocator<codept>_>::size
                      ((vector<codept,_std::allocator<codept>_> *)((long)&code.descr.field_2 + 8));
    if (local_8f0 == sVar6 - 1) {
      std::operator<<(local_890,"};");
    }
    else {
      std::operator<<(local_890,", ");
    }
  }
  std::ofstream::close();
  std::ios::clear((long)&fields.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage +
                  fields.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage[-1]._M_string_length,0);
  std::fpos<__mbstate_t>::fpos
            ((fpos<__mbstate_t> *)
             &fields_1.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,0);
  std::istream::seekg(&fields.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage,
                      fields_1.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,local_900);
  std::vector<codept,_std::allocator<codept>_>::clear
            ((vector<codept,_std::allocator<codept>_> *)((long)&code.descr.field_2 + 8));
  while (bVar2 = std::ios::operator_cast_to_bool
                           ((ios *)((long)&fields.
                                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_end_of_storage +
                                   fields.
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage[-1].
                                   _M_string_length)), bVar2) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_920);
    std::istream::getline
              ((char *)&fields.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage,
               (long)&tab.super__Vector_base<codept,_std::allocator<codept>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage);
    sVar9 = strlen((char *)&tab.super__Vector_base<codept,_std::allocator<codept>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage);
    if (((sVar9 != 0) &&
        ((char)tab.super__Vector_base<codept,_std::allocator<codept>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage != '#')) &&
       ((char)tab.super__Vector_base<codept,_std::allocator<codept>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage != '\r')) {
      parse((char *)&tab.super__Vector_base<codept,_std::allocator<codept>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage,
            (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_920);
      pvVar10 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)local_920,0xc);
      bVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                        (pvVar10);
      if (!bVar2) {
        pvVar10 = std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)local_920,0xc);
        pcVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 c_str(pvVar10);
        lVar11 = strtol(pcVar8,(char **)0x0,0x10);
        local_458._0_4_ = (undefined4)lVar11;
        pvVar10 = std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)local_920,0);
        pcVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 c_str(pvVar10);
        lVar11 = strtol(pcVar8,(char **)0x0,0x10);
        local_458._4_4_ = (undefined4)lVar11;
        pvVar10 = std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)local_920,1);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&code,
                   pvVar10);
        std::vector<codept,_std::allocator<codept>_>::push_back
                  ((vector<codept,_std::allocator<codept>_> *)((long)&code.descr.field_2 + 8),
                   (value_type *)local_458);
      }
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_920);
  }
  pcVar8 = argv[2];
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_960,pcVar8,(allocator<char> *)((long)&i_3 + 7));
  std::operator+(&local_940,&local_960,"/lowertab.h");
  std::ofstream::open(local_890,&local_940,0x10);
  std::__cxx11::string::~string((string *)&local_940);
  std::__cxx11::string::~string((string *)&local_960);
  std::allocator<char>::~allocator((allocator<char> *)((long)&i_3 + 7));
  poVar5 = std::operator<<(local_890,"//Lower case table");
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,std::dec);
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  poVar5 = std::operator<<(poVar5,"static const char32_t l2u [");
  sVar6 = std::vector<codept,_std::allocator<codept>_>::size
                    ((vector<codept,_std::allocator<codept>_> *)((long)&code.descr.field_2 + 8));
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,sVar6);
  poVar5 = std::operator<<(poVar5,"] = { ");
  std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  std::ostream::operator<<(local_890,std::hex);
  for (local_970 = 0;
      sVar6 = std::vector<codept,_std::allocator<codept>_>::size
                        ((vector<codept,_std::allocator<codept>_> *)((long)&code.descr.field_2 + 8))
      , local_970 < sVar6; local_970 = local_970 + 1) {
    poVar5 = std::operator<<(local_890,"  0x");
    _Var3 = std::setfill<char>('0');
    poVar5 = std::operator<<(poVar5,_Var3._M_c);
    _Var4 = std::setw(5);
    poVar5 = std::operator<<(poVar5,_Var4);
    pvVar7 = std::vector<codept,_std::allocator<codept>_>::operator[]
                       ((vector<codept,_std::allocator<codept>_> *)((long)&code.descr.field_2 + 8),
                        local_970);
    std::ostream::operator<<(poVar5,pvVar7->lc);
    sVar6 = std::vector<codept,_std::allocator<codept>_>::size
                      ((vector<codept,_std::allocator<codept>_> *)((long)&code.descr.field_2 + 8));
    if (local_970 == sVar6 - 1) {
      std::operator<<(local_890,"};");
    }
    else {
      std::operator<<(local_890,", ");
    }
    poVar5 = std::operator<<(local_890,"// ");
    pvVar7 = std::vector<codept,_std::allocator<codept>_>::operator[]
                       ((vector<codept,_std::allocator<codept>_> *)((long)&code.descr.field_2 + 8),
                        local_970);
    pcVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       (&pvVar7->descr);
    poVar5 = std::operator<<(poVar5,pcVar8);
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  }
  poVar5 = (ostream *)std::ostream::operator<<(local_890,std::dec);
  std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  poVar5 = std::operator<<(local_890,"//Upper case equivalents");
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  poVar5 = std::operator<<(poVar5,"static const char32_t uc [");
  sVar6 = std::vector<codept,_std::allocator<codept>_>::size
                    ((vector<codept,_std::allocator<codept>_> *)((long)&code.descr.field_2 + 8));
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,sVar6);
  poVar5 = std::operator<<(poVar5,"] = { ");
  std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  std::ostream::operator<<(local_890,std::hex);
  for (local_980 = 0;
      sVar6 = std::vector<codept,_std::allocator<codept>_>::size
                        ((vector<codept,_std::allocator<codept>_> *)((long)&code.descr.field_2 + 8))
      , local_980 < sVar6; local_980 = local_980 + 1) {
    if ((local_980 & 7) == 0) {
      poVar5 = (ostream *)std::ostream::operator<<(local_890,std::endl<char,std::char_traits<char>>)
      ;
      std::operator<<(poVar5,"  ");
    }
    poVar5 = std::operator<<(local_890,"0x");
    _Var3 = std::setfill<char>('0');
    poVar5 = std::operator<<(poVar5,_Var3._M_c);
    _Var4 = std::setw(5);
    poVar5 = std::operator<<(poVar5,_Var4);
    pvVar7 = std::vector<codept,_std::allocator<codept>_>::operator[]
                       ((vector<codept,_std::allocator<codept>_> *)((long)&code.descr.field_2 + 8),
                        local_980);
    std::ostream::operator<<(poVar5,pvVar7->uc);
    sVar6 = std::vector<codept,_std::allocator<codept>_>::size
                      ((vector<codept,_std::allocator<codept>_> *)((long)&code.descr.field_2 + 8));
    if (local_980 == sVar6 - 1) {
      std::operator<<(local_890,"};");
    }
    else {
      std::operator<<(local_890,", ");
    }
  }
  std::ofstream::close();
  std::ifstream::close();
  std::ofstream::~ofstream(local_890);
  std::ifstream::~ifstream
            (&fields.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  codept::~codept((codept *)local_458);
  std::vector<codept,_std::allocator<codept>_>::~vector
            ((vector<codept,_std::allocator<codept>_> *)((long)&code.descr.field_2 + 8));
  return 0;
}

Assistant:

int main (int argc, char **argv)
{
  char line[1024];
  vector<codept> tab;

  codept code;
  printf ("gen_casetab running. Command line is:\n");
  for (int i = 0; i < argc; i++)
  {
    printf ("`%s` ", argv[i]);
  }
  printf ("\n");

  if (argc < 2)
  {
    fprintf (stderr, "Usage: gen_casetab <input table> <output folder>\n");
    exit (1);
  }
  ifstream in (argv[1]);

  if (!in.is_open ())
  {
    fprintf (stderr, "gen_casetab: cannot open input table: %s\n", argv[1]);
    exit (1);
  }
  printf ("Starting...\n");

  //Generate upper case -> lower case table
  while (in)
  {
    vector<string> fields;
    in.getline (line, sizeof (line));
    // printf ("%s\n", line);
    if (!strlen(line) || line[0] == '#' || line[0] == '\r')
      continue; //ignore empty and comment lines
    if (!parse (line, fields))
    {
      printf ("Cannot parse line:\n%s\n", line);
      continue;
    }
    if (fields[LC_FIELD].empty ())
      continue;

    code.uc = strtol (fields[CODE_FIELD].c_str(), nullptr, 16);
    code.lc = strtol (fields[LC_FIELD].c_str(), nullptr, 16);
    code.descr = fields[DESCR_FIELD];
    tab.push_back (code);
  }

  ofstream out (string(argv[2]) + "/uppertab.h");
  out << "//Upper case table" << endl
    << "static const char32_t u2l [" << tab.size() << "] = { " << endl;
  out << hex;
  for (size_t i=0; i<tab.size(); i++)
  {
    out << "  0x" << std::setfill ('0') << std::setw (5) << tab[i].uc;
    if (i == tab.size () - 1)
      out << "};";
    else
      out << ", ";
    out << "// " << tab[i].descr.c_str() << endl;
  }
  out << dec << endl;
  out << "//Lower case equivalents" << endl
    << "static const char32_t lc [" << tab.size () << "] = { ";
  out << hex;
  for (size_t i = 0; i < tab.size (); i++)
  {
    if (i % 8 == 0)
      out << endl << "  ";
    out << "0x" << std::setfill ('0') << std::setw (5) << tab[i].lc;
    if (i == tab.size () - 1)
      out << "};";
    else
      out << ", ";
  }
  out.close ();

  in.clear ();
  in.seekg (0); //rewind
  tab.clear ();

  //Generate lower case -> upper case table
  while (in)
  {
    vector<string> fields;
    in.getline (line, sizeof (line));
    // printf ("%s\n", line);
    if (!strlen (line) || line[0] == '#' || line[0] == '\r')
      continue; //ignore empty and comment lines
    parse (line, fields);
    if (fields[UC_FIELD].empty ())
      continue;

    code.uc = strtol (fields[UC_FIELD].c_str (), nullptr, 16);
    code.lc = strtol (fields[CODE_FIELD].c_str (), nullptr, 16);
    code.descr = fields[DESCR_FIELD];
    tab.push_back (code);
  }

  out.open (string(argv[2]) + "/lowertab.h");
  out << "//Lower case table" << dec << endl
    << "static const char32_t l2u [" << tab.size () << "] = { " << endl;
  out << hex;
  for (size_t i = 0; i < tab.size (); i++)
  {
    out << "  0x" << std::setfill ('0') << std::setw (5) << tab[i].lc;
    if (i == tab.size () - 1)
      out << "};";
    else
      out << ", ";
    out << "// " << tab[i].descr.c_str () << endl;
  }
  out << dec << endl;
  out << "//Upper case equivalents" << endl
    << "static const char32_t uc [" << tab.size () << "] = { " << endl;
  out << hex;
  for (size_t i = 0; i < tab.size (); i++)
  {
    if (i % 8 == 0)
      out << endl << "  ";
    out << "0x" << std::setfill ('0') << std::setw (5) << tab[i].uc;
    if (i == tab.size () - 1)
      out << "};";
    else
      out << ", ";
  }
  out.close ();

  in.close ();
  return 0;
}